

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ReturningSubqueryCorrelated(Walker *pWalker,Select *pSelect)

{
  byte *pbVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (long)pSelect->pSrc->nSrc;
  if (0 < lVar2) {
    lVar3 = 0;
    do {
      if (*(NameContext **)((long)&pSelect->pSrc->a[0].pSTab + lVar3) == (pWalker->u).pNC) {
        pbVar1 = (byte *)((long)&pSelect->selFlags + 3);
        *pbVar1 = *pbVar1 | 0x20;
        pWalker->eCode = 1;
        return 0;
      }
      lVar3 = lVar3 + 0x48;
    } while (lVar2 * 0x48 != lVar3);
  }
  return 0;
}

Assistant:

static int sqlite3ReturningSubqueryCorrelated(Walker *pWalker, Select *pSelect){
  int i;
  SrcList *pSrc;
  assert( pSelect!=0 );
  pSrc = pSelect->pSrc;
  assert( pSrc!=0 );
  for(i=0; i<pSrc->nSrc; i++){
    if( pSrc->a[i].pSTab==pWalker->u.pTab ){
      testcase( pSelect->selFlags & SF_Correlated );
      pSelect->selFlags |= SF_Correlated;
      pWalker->eCode = 1;
      break;
    }
  }
  return WRC_Continue;
}